

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::packRows(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  U *pUVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  pointer pnVar6;
  int *piVar7;
  int *piVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int *piVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  Dring *pDVar22;
  fpclass_type *pfVar23;
  
  pUVar1 = &this->u;
  pDVar22 = (this->u).row.list.next;
  piVar16 = (this->u).row.max;
  if ((U *)pDVar22 == pUVar1) {
    uVar17 = 0;
  }
  else {
    piVar5 = (this->u).row.idx;
    pnVar6 = (this->u).row.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar7 = (this->u).row.len;
    piVar8 = (this->u).row.start;
    uVar19 = 0;
    do {
      iVar2 = pDVar22->idx;
      if (piVar8[iVar2] != (int)uVar19) {
        do {
          iVar2 = pDVar22->idx;
          iVar3 = piVar8[iVar2];
          lVar20 = (long)iVar3;
          piVar8[iVar2] = (int)uVar19;
          iVar4 = piVar7[iVar2];
          piVar16[iVar2] = iVar4;
          if (0 < iVar4) {
            uVar18 = (ulong)(int)uVar19;
            uVar19 = uVar18;
            lVar21 = lVar20;
            pfVar23 = &(pnVar6->m_backend).fpclass;
            do {
              piVar5[uVar19] = piVar5[lVar21];
              uVar9 = *(undefined8 *)(pfVar23 + lVar20 * 0x14 + -0x12);
              uVar10 = *(undefined8 *)(pfVar23 + lVar20 * 0x14 + -0x12 + 2);
              uVar11 = *(undefined8 *)(pfVar23 + lVar20 * 0x14 + -0xe);
              uVar12 = *(undefined8 *)(pfVar23 + lVar20 * 0x14 + -0xe + 2);
              uVar13 = *(undefined8 *)(pfVar23 + lVar20 * 0x14 + -10);
              uVar14 = *(undefined8 *)(pfVar23 + lVar20 * 0x14 + -10 + 2);
              uVar15 = *(undefined8 *)(pfVar23 + lVar20 * 0x14 + -6 + 2);
              *(undefined8 *)(pfVar23 + uVar18 * 0x14 + -6) =
                   *(undefined8 *)(pfVar23 + lVar20 * 0x14 + -6);
              *(undefined8 *)(pfVar23 + uVar18 * 0x14 + -6 + 2) = uVar15;
              *(undefined8 *)(pfVar23 + uVar18 * 0x14 + -10) = uVar13;
              *(undefined8 *)(pfVar23 + uVar18 * 0x14 + -10 + 2) = uVar14;
              *(undefined8 *)(pfVar23 + uVar18 * 0x14 + -0xe) = uVar11;
              *(undefined8 *)(pfVar23 + uVar18 * 0x14 + -0xe + 2) = uVar12;
              *(undefined8 *)(pfVar23 + uVar18 * 0x14 + -0x12) = uVar9;
              *(undefined8 *)(pfVar23 + uVar18 * 0x14 + -0x12 + 2) = uVar10;
              pfVar23[uVar18 * 0x14 + -2] = pfVar23[lVar20 * 0x14 + -2];
              *(char *)(pfVar23 + uVar18 * 0x14 + -1) = (char)pfVar23[lVar20 * 0x14 + -1];
              *(undefined8 *)(pfVar23 + uVar18 * 0x14) = *(undefined8 *)(pfVar23 + lVar20 * 0x14);
              lVar21 = lVar21 + 1;
              uVar19 = uVar19 + 1;
              pfVar23 = pfVar23 + 0x14;
            } while (lVar21 < iVar4 + iVar3);
          }
          uVar17 = (uint)uVar19;
          pDVar22 = pDVar22->next;
        } while ((U *)pDVar22 != pUVar1);
        piVar16 = (this->u).row.max;
        break;
      }
      iVar3 = piVar7[iVar2];
      uVar17 = (int)uVar19 + iVar3;
      uVar19 = (ulong)uVar17;
      piVar16[iVar2] = iVar3;
      pDVar22 = pDVar22->next;
    } while ((U *)pDVar22 != pUVar1);
  }
  piVar16[this->thedim] = 0;
  (this->u).row.used = uVar17;
  return;
}

Assistant:

void CLUFactor<R>::packRows()
{
   int n, i, j, l_row;
   Dring* ring, *list;

   int* l_ridx = u.row.idx;
   R* l_rval = u.row.val.data();
   int* l_rlen = u.row.len;
   int* l_rmax = u.row.max;
   int* l_rbeg = u.row.start;

   n = 0;
   list = &(u.row.list);

   for(ring = list->next; ring != list; ring = ring->next)
   {
      l_row = ring->idx;

      if(l_rbeg[l_row] != n)
      {
         do
         {
            l_row = ring->idx;
            i = l_rbeg[l_row];
            assert(l_rlen[l_row] <= l_rmax[l_row]);
            l_rbeg[l_row] = n;
            l_rmax[l_row] = l_rlen[l_row];
            j = i + l_rlen[l_row];

            for(; i < j; ++i, ++n)
            {
               assert(n <= i);
               l_ridx[n] = l_ridx[i];
               l_rval[n] = l_rval[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackRows;
      }

      n += l_rlen[l_row];

      l_rmax[l_row] = l_rlen[l_row];
   }

terminatePackRows:

   u.row.max[thedim] = 0;
   u.row.used = n;
}